

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void object_curses_find_to_a(player *p,object *obj)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0xffffffff;
  if (rune_max != 0) {
    piVar2 = &rune_list->index;
    uVar4 = 0;
    do {
      if ((((rune *)(piVar2 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar2 == 0)) {
        uVar1 = uVar4 & 0xffffffff;
        break;
      }
      uVar4 = uVar4 + 1;
      piVar2 = piVar2 + 6;
    } while (rune_max != uVar4);
  }
  if ((obj->curses != (curse_data *)0x0) && (1 < z_info->curse_max)) {
    uVar4 = 1;
    do {
      if (((obj->curses[uVar4].power != L'\0') && (curses[uVar4].obj != (object *)0x0)) &&
         ((curses[uVar4].obj)->to_a != 0)) {
        player_learn_rune(p,(long)(int)uVar1,true);
        uVar1 = 0xffffffff;
        if (rune_max != 0) {
          piVar2 = &rune_list->index;
          uVar3 = 0;
          do {
            if ((((rune *)(piVar2 + -1))->variety == RUNE_VAR_CURSE) && (uVar4 == (uint)*piVar2)) {
              if (-1 < (int)(uint)uVar3) {
                player_learn_rune(p,(ulong)((uint)uVar3 & 0x7fffffff),true);
              }
              uVar1 = uVar3 & 0xffffffff;
              break;
            }
            uVar3 = uVar3 + 1;
            piVar2 = piVar2 + 6;
          } while (rune_max != uVar3);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < z_info->curse_max);
  }
  return;
}

Assistant:

static void object_curses_find_to_a(struct player *p, struct object *obj)
{
	int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_A);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			if (curses[i].obj->to_a != 0) {
				player_learn_rune(p, index, true);

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}
}